

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestSpec::NamePattern::NamePattern(NamePattern *this,string *name,string *filterString)

{
  string local_40;
  string *local_20;
  string *filterString_local;
  string *name_local;
  NamePattern *this_local;
  
  local_20 = filterString;
  filterString_local = name;
  name_local = (string *)this;
  Pattern::Pattern(&this->super_Pattern,filterString);
  (this->super_Pattern)._vptr_Pattern = (_func_int **)&PTR__NamePattern_002b0228;
  toLower(&local_40,filterString_local);
  WildcardPattern::WildcardPattern(&this->m_wildcardPattern,&local_40,No);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

TestSpec::NamePattern::NamePattern( std::string const& name, std::string const& filterString )
    : Pattern( filterString )
    , m_wildcardPattern( toLower( name ), CaseSensitive::No )
    {}